

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_File.cpp
# Opt level: O0

uint64_t axl::io::copyFile(StringRef *srcFileName,StringRef *dstFileName,uint64_t size)

{
  uint uVar1;
  StringRef *in_RDX;
  File *in_RSI;
  char *in_RDI;
  bool result;
  File srcFile;
  undefined4 in_stack_ffffffffffffffd8;
  File in_stack_ffffffffffffffdc;
  uint64_t local_8;
  
  File::File((File *)0x1a8542);
  uVar1 = File::open((File *)&stack0xffffffffffffffdc,in_RDI,1);
  if ((uVar1 & 1) == 0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_8 = copyFile(in_RSI,in_RDX,
                       CONCAT44(in_stack_ffffffffffffffdc.m_file.
                                super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
                                m_h,CONCAT13((char)uVar1,(int3)in_stack_ffffffffffffffd8)) &
                       0xffffffff01ffffff);
  }
  File::~File((File *)0x1a85d1);
  return local_8;
}

Assistant:

uint64_t
copyFile(
	const sl::StringRef& srcFileName,
	const sl::StringRef& dstFileName,
	uint64_t size
) {
	File srcFile;
	bool result = srcFile.open(srcFileName, FileFlag_ReadOnly);
	if (!result)
		return -1;

	return copyFile(&srcFile, dstFileName, size);
}